

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.h
# Opt level: O1

char * __thiscall
embree::Buffer::alloc(Buffer *this,void *ptr_in,bool *shared,EmbreeMemoryType memoryType)

{
  int iVar1;
  undefined4 extraout_var;
  
  if (ptr_in != (void *)0x0) {
    *shared = true;
    return (char *)ptr_in;
  }
  *shared = false;
  (*(this->device->super_State).super_RefCount._vptr_RefCount[4])(this->device,this->numBytes,0);
  iVar1 = (*(this->device->super_State).super_RefCount._vptr_RefCount[8])
                    (this->device,this->numBytes + 0xf & 0xfffffffffffffff0,0x10,(ulong)memoryType);
  return (char *)CONCAT44(extraout_var,iVar1);
}

Assistant:

char* alloc(void* ptr_in, bool &shared, EmbreeMemoryType memoryType)
    {
      if (ptr_in)
      {
        shared = true;
        return (char*)ptr_in;
      }
      else
      {
        shared = false;
        device->memoryMonitor(this->bytes(), false);
        size_t b = (this->bytes()+15) & ssize_t(-16);
        return (char*)device->malloc(b,16,memoryType);
      }
    }